

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_long,unsigned_long>
          (Thread *this,UnopFunc<unsigned_long,_unsigned_long> *f)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  unsigned_long *__first;
  unsigned_long *__last;
  unsigned_long *__result;
  unsigned_long local_38;
  SR result;
  Simd<unsigned_long,_(unsigned_char)__x02_> val;
  UnopFunc<unsigned_long,_unsigned_long> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  __first = std::begin<unsigned_long,2ul>((unsigned_long (*) [2])(result.v + 1));
  __last = std::end<unsigned_long,2ul>((unsigned_long (*) [2])(result.v + 1));
  __result = std::begin<unsigned_long,2ul>((unsigned_long (*) [2])&local_38);
  std::transform<unsigned_long*,unsigned_long*,unsigned_long(*)(unsigned_long)>
            (__first,__last,__result,f);
  value.v[1] = result.v[0];
  value.v[0] = local_38;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}